

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

void __thiscall Buffer::~Buffer(Buffer *this)

{
  Buffer *this_local;
  
  this->_vptr_Buffer = (_func_int **)&PTR__Buffer_001a5b78;
  if (((this->owned & 1U) != 0) && (this->data != (void *)0x0)) {
    free(this->data);
  }
  std::shared_ptr<Buffer>::~shared_ptr(&this->parent);
  std::enable_shared_from_this<Buffer>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<Buffer>);
  return;
}

Assistant:

Buffer::~Buffer() {
  if (owned && (data != nullptr)) {
    ::free(data);
  }
}